

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t rtosc_message_ring_length(ring_t *ring)

{
  uint uVar1;
  uchar uVar2;
  byte bVar3;
  int iVar4;
  ring_t *in_RDI;
  uint32_t i_1;
  char arg_1;
  int arg;
  uint toparse;
  int arguments;
  uint aligned_pos;
  int i;
  uint pos;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_28;
  int local_24;
  uint local_20;
  int local_18;
  uint local_14;
  size_t local_8;
  
  uVar2 = deref(0,in_RDI);
  if (((((uVar2 == '#') && (uVar2 = deref(1,in_RDI), uVar2 == 'b')) &&
       (uVar2 = deref(2,in_RDI), uVar2 == 'u')) &&
      ((uVar2 = deref(3,in_RDI), uVar2 == 'n' && (uVar2 = deref(4,in_RDI), uVar2 == 'd')))) &&
     ((uVar2 = deref(5,in_RDI), uVar2 == 'l' &&
      ((uVar2 = deref(6,in_RDI), uVar2 == 'e' && (uVar2 = deref(7,in_RDI), uVar2 == '\0')))))) {
    local_8 = bundle_ring_length((ring_t *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    local_14 = 0;
    uVar1 = local_14;
    do {
      local_14 = uVar1;
      uVar2 = deref(local_14,in_RDI);
      uVar1 = local_14 + 1;
    } while (uVar2 != '\0');
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      local_14 = local_14 + 1;
      uVar2 = deref(local_14,in_RDI);
      if (uVar2 != '\0') break;
    }
    uVar1 = local_14;
    uVar2 = deref(local_14,in_RDI);
    if (uVar2 == ',') {
      do {
        local_14 = local_14 + 1;
        uVar2 = deref(local_14,in_RDI);
      } while (uVar2 != '\0');
      local_14 = (4 - (local_14 - uVar1 & 3)) + local_14;
      local_24 = 0;
      local_28 = uVar1;
      while( true ) {
        local_28 = local_28 + 1;
        uVar2 = deref(local_28,in_RDI);
        local_20 = uVar1;
        if (uVar2 == '\0') break;
        uVar2 = deref(local_28,in_RDI);
        iVar4 = has_reserved(uVar2);
        local_24 = iVar4 + local_24;
      }
      while (local_20 = local_20 + 1, local_24 != 0) {
        uVar2 = deref(local_20,in_RDI);
        switch(uVar2) {
        case 'S':
        case 's':
          do {
            local_14 = local_14 + 1;
            uVar2 = deref(local_14,in_RDI);
          } while (uVar2 != '\0');
          local_14 = (4 - (local_14 - uVar1 & 3)) + local_14;
          local_24 = local_24 + -1;
          break;
        default:
          break;
        case 'b':
          uVar5 = 0;
          bVar3 = deref(local_14,in_RDI);
          uVar5 = (uint)bVar3 << 0x18 | uVar5;
          bVar3 = deref(local_14 + 1,in_RDI);
          uVar5 = (uint)bVar3 << 0x10 | uVar5;
          bVar3 = deref(local_14 + 2,in_RDI);
          uVar5 = (uint)bVar3 << 8 | uVar5;
          bVar3 = deref(local_14 + 3,in_RDI);
          local_14 = (bVar3 | uVar5) + local_14 + 4;
          if ((local_14 - uVar1 & 3) != 0) {
            local_14 = (4 - (local_14 - uVar1 & 3)) + local_14;
          }
          local_24 = local_24 + -1;
          break;
        case 'c':
        case 'f':
        case 'i':
        case 'm':
        case 'r':
          local_14 = local_14 + 4;
          local_24 = local_24 + -1;
          break;
        case 'd':
        case 'h':
        case 't':
          local_14 = local_14 + 8;
          local_24 = local_24 + -1;
        }
      }
      if (in_RDI->len + in_RDI[1].len < (ulong)local_14) {
        local_3c = 0;
      }
      else {
        local_3c = local_14;
      }
      local_8 = (size_t)local_3c;
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t rtosc_message_ring_length(ring_t *ring)
{
    //Check if the message is a bundle
    if(deref(0,ring) == '#' &&
            deref(1,ring) == 'b' &&
            deref(2,ring) == 'u' &&
            deref(3,ring) == 'n' &&
            deref(4,ring) == 'd' &&
            deref(5,ring) == 'l' &&
            deref(6,ring) == 'e' &&
            deref(7,ring) == '\0')
        return bundle_ring_length(ring);

    //Proceed for normal messages
    //Consume path
    unsigned pos = 0;
    while(deref(pos++,ring));
    pos--;

    //Travel through the null word end [1..4] bytes
    for(int i=0; i<4; ++i)
        if(deref(++pos, ring))
            break;

    if(deref(pos, ring) != ',')
        return 0;

    unsigned aligned_pos = pos;
    int arguments = pos+1;
    while(deref(++pos,ring));
    pos += 4-(pos-aligned_pos)%4;

    unsigned toparse = 0;
    {
        int arg = arguments-1;
        while(deref(++arg,ring))
            toparse += has_reserved(deref(arg,ring));
    }

    //Take care of varargs
    while(toparse)
    {
        char arg = deref(arguments++,ring);
        assert(arg);
        uint32_t i;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                pos += 8;
                --toparse;
                break;
            case 'm':
            case 'r':
            case 'c':
            case 'f':
            case 'i':
                pos += 4;
                --toparse;
                break;
            case 'S':
            case 's':
                while(deref(++pos,ring));
                pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            case 'b':
                i = 0;
                i |= (deref(pos++,ring) << 24);
                i |= (deref(pos++,ring) << 16);
                i |= (deref(pos++,ring) << 8);
                i |= (deref(pos++,ring));
                pos += i;
                if((pos-aligned_pos)%4)
                    pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            default:
                ;
        }
    }


    return pos <= (ring[0].len+ring[1].len) ? pos : 0;
}